

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::BringWindowToFocusFront(ImGuiWindow *window)

{
  ImGuiWindow **ppIVar1;
  ImGuiWindow **__src;
  int i;
  ImVector<ImGuiWindow_*> *this;
  int i_00;
  
  this = &GImGui->WindowsFocusOrder;
  ppIVar1 = ImVector<ImGuiWindow_*>::back(this);
  if (*ppIVar1 != window) {
    i = this->Size + -1;
    do {
      i_00 = i;
      i = i_00 + -1;
      if (i < 0) {
        return;
      }
      ppIVar1 = ImVector<ImGuiWindow_*>::operator[](this,i);
    } while (*ppIVar1 != window);
    ppIVar1 = ImVector<ImGuiWindow_*>::operator[](this,i_00 + -1);
    __src = ImVector<ImGuiWindow_*>::operator[](this,i_00);
    memmove(ppIVar1,__src,(long)(this->Size - i_00) << 3);
    ppIVar1 = ImVector<ImGuiWindow_*>::operator[](this,this->Size + -1);
    *ppIVar1 = window;
  }
  return;
}

Assistant:

void ImGui::BringWindowToFocusFront(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    if (g.WindowsFocusOrder.back() == window)
        return;
    for (int i = g.WindowsFocusOrder.Size - 2; i >= 0; i--) // We can ignore the front most window
        if (g.WindowsFocusOrder[i] == window)
        {
            memmove(&g.WindowsFocusOrder[i], &g.WindowsFocusOrder[i + 1], (size_t)(g.WindowsFocusOrder.Size - i - 1) * sizeof(ImGuiWindow*));
            g.WindowsFocusOrder[g.WindowsFocusOrder.Size - 1] = window;
            break;
        }
}